

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O3

Var Js::JavascriptDate::EntryGetUTCDate(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Var pvVar5;
  JavascriptDate *pJVar6;
  ScriptContext *pSVar7;
  double value;
  int in_stack_00000010;
  undefined1 local_40 [8];
  CallInfo callInfo_local;
  Var result;
  ArgumentReader args;
  
  pSVar7 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = (undefined1  [8])callInfo;
  ThreadContext::ProbeStack(pSVar7->threadContext,0xc00,pSVar7,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x24e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00bb5cb1;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  pSVar7 = (ScriptContext *)local_40;
  result = (Var)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&result,(CallInfo *)pSVar7);
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    pSVar7 = (ScriptContext *)0x251;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x251,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
LAB_00bb5cb1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (((ulong)result & 0xffffff) != 0) {
    pSVar7 = (ScriptContext *)0x0;
    pvVar5 = Arguments::operator[]((Arguments *)&result,0);
    bVar2 = VarIs<Js::JavascriptDate>(pvVar5);
    if (bVar2) {
      pvVar5 = Arguments::operator[]((Arguments *)&result,0);
      pJVar6 = VarTo<Js::JavascriptDate>(pvVar5);
      value = DateImplementation::GetDateData(&pJVar6->m_date,(DateData)0x3,true,scriptContext);
      pvVar5 = JavascriptNumber::ToVarIntCheck(value,scriptContext);
      return pvVar5;
    }
  }
  callInfo_local = (CallInfo)0x0;
  BVar3 = TryInvokeRemotely(EntryGetUTCDate,pSVar7,(Arguments *)&result,(Var *)&callInfo_local);
  if (BVar3 != 0) {
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec3d,L"Date.prototype.getUTCDate");
}

Assistant:

Var JavascriptDate::EntryGetUTCDate(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<JavascriptDate>(args[0]))
        {
            Var result = nullptr;
            if (TryInvokeRemotely(EntryGetUTCDate, scriptContext, args, &result))
            {
                return result;
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDate, _u("Date.prototype.getUTCDate"));
        }
        JavascriptDate* date = VarTo<JavascriptDate>(args[0]);

        return JavascriptDate::GetUTCDateData(date, DateImplementation::DateData::Date, scriptContext);
    }